

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

void socket_error_callback(void *vs)

{
  int __errnum;
  long *plVar1;
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = find234(sktree,vs,(cmpfn234)0x0);
  if ((pvVar2 != (void *)0x0) && (__errnum = *(int *)((long)vs + 0x5c), __errnum != 0)) {
    plVar1 = *(long **)((long)vs + 0x10);
    pcVar3 = strerror(__errnum);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar1 + 8);
    (*UNRECOVERED_JUMPTABLE)(plVar1,(__errnum == 0x20) + '\x01',pcVar3,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

static void socket_error_callback(void *vs)
{
    NetSocket *s = (NetSocket *)vs;

    /*
     * Just in case other socket work has caused this socket to vanish
     * or become somehow non-erroneous before this callback arrived...
     */
    if (!find234(sktree, s, NULL) || !s->pending_error)
        return;

    /*
     * An error has occurred on this socket. Pass it to the plug.
     */
    plug_closing_errno(s->plug, s->pending_error);
}